

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defer.c
# Opt level: O1

int main(void)

{
  sem_t *__sem;
  runnable_t runnable;
  sem_t *__sem_00;
  int iVar1;
  undefined1 local_d8 [8];
  thread_pool_t pool;
  
  thread_pool_init((thread_pool_t *)local_d8,10);
  __sem_00 = (sem_t *)malloc(0x40);
  __sem = __sem_00 + 1;
  sem_init(__sem_00,0,0);
  sem_init(__sem,0,0);
  pool.pool_mutex._24_8_ = pong_ping;
  runnable.arg = __sem_00;
  runnable.function = pong_ping;
  runnable.argsz = 0x40;
  defer((thread_pool_t *)local_d8,runnable);
  iVar1 = 100;
  do {
    sem_post(__sem_00);
    sem_wait(__sem);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  sem_destroy(__sem);
  free(__sem_00);
  thread_pool_destroy((thread_pool *)local_d8);
  tests_run = tests_run + 1;
  puts(
      "/workspace/llm4binary/github/license_all_cmakelists_1510/asledz[P]ASYNC_C/test/defer.c: ALL TESTS PASSED"
      );
  printf("/workspace/llm4binary/github/license_all_cmakelists_1510/asledz[P]ASYNC_C/test/defer.cTests run: %d\n"
         ,(ulong)(uint)tests_run);
  return 0;
}

Assistant:

int main() {
  char *result = all_tests();
  if (result != 0) {
    printf(__FILE__ ": %s\n", result);
  } else {
    printf(__FILE__ ": ALL TESTS PASSED\n");
  }
  printf(__FILE__ "Tests run: %d\n", tests_run);

  return result != 0;
}